

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool server::setmaster(clientinfo *ci,bool val,char *pass,char *authname,char *authdesc,int authpriv
                      ,bool force,bool trial)

{
  long lVar1;
  clientinfo *pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  char *fmt;
  char *pcVar9;
  string msg;
  packetbuf local_168;
  char *local_140;
  uchar local_138 [264];
  
  if (authname != (char *)0x0 && !val) {
    return false;
  }
  if (val) {
    local_140 = authdesc;
    if (*adminpass != '\0') {
      hashpassword(ci->clientnum,ci->sessionid,adminpass,(char *)local_138,0x104);
      iVar3 = strcmp((char *)local_138,pass);
      if (iVar3 == 0) {
        authpriv = 3;
      }
    }
    iVar3 = 3;
    if (ci->local == false) {
      iVar3 = authpriv;
    }
    if (iVar3 <= ci->privilege) {
      return true;
    }
    if (iVar3 < 2 && !force) {
      if ((ci->state).state == 5) {
        iVar3 = ci->clientnum;
        pcVar9 = "Spectators may not claim master.";
LAB_001389fa:
        sendf(iVar3,1,"ris",0x23,pcVar9);
        return false;
      }
      if ((enablemultiplemasters == 0) && (0 < (long)DAT_00193844)) {
        lVar4 = 0;
        do {
          pcVar2 = *(clientinfo **)(clients + lVar4 * 8);
          if ((pcVar2 != ci) && (pcVar2->privilege != 0)) {
            iVar3 = ci->clientnum;
            pcVar9 = "\f3Error: Someone already has privileges";
            goto LAB_001389fa;
          }
          lVar4 = lVar4 + 1;
        } while (DAT_00193844 != lVar4);
      }
      if ((authname == (char *)0x0) &&
         (((mastermask & 0x1000) == 0 && ci->privilege == 0) && ci->local == false)) {
        iVar3 = ci->clientnum;
        pcVar9 = "This server requires you to use the \"/auth\" command to claim master.";
        goto LAB_001389fa;
      }
    }
    if (trial) {
      return true;
    }
    ci->privilege = iVar3;
    authdesc = local_140;
    if (iVar3 - 1U < 3) {
      pcVar9 = (&PTR_anon_var_dwarf_37a19_001816a0)[iVar3 - 1U];
    }
    else {
      pcVar9 = "\f1unknown";
    }
  }
  else {
    iVar3 = ci->privilege;
    if (iVar3 == 0 || trial) {
      return iVar3 != 0;
    }
    if (iVar3 - 1U < 3) {
      pcVar9 = (&PTR_anon_var_dwarf_37a19_001816a0)[iVar3 - 1U];
    }
    else {
      pcVar9 = "\f1unknown";
    }
    ci->privilege = 0;
    if (((ci->state).state == 5) && (ci->local == false)) {
      aiman::removeai(ci);
    }
  }
  lVar4 = (long)DAT_00193844;
  if (lVar4 < 1) {
LAB_00138b2a:
    mastermode = 0;
    _DAT_00193b6c = 0;
  }
  else {
    lVar7 = 0;
    bVar8 = false;
    do {
      while( true ) {
        lVar7 = lVar7 + 1;
        lVar1 = *(long *)(clients + -8 + lVar7 * 8);
        if ((*(char *)(lVar1 + 0x339) != '\0') || (0 < *(int *)(lVar1 + 0x334))) break;
        if (lVar7 == lVar4) {
          if (!bVar8) goto LAB_00138b2a;
          goto LAB_00138b38;
        }
      }
      bVar8 = true;
    } while (lVar7 != lVar4);
  }
LAB_00138b38:
  if (val && authname != (char *)0x0) {
    if ((authdesc != (char *)0x0) && (*authdesc != '\0')) {
      local_168.super_ucharbuf.buf = local_138;
      pcVar5 = colorname(ci);
      stringformatter::operator()
                ((stringformatter *)&local_168,
                 "\f0%s \f7claimed \f6%s \f7as \'\fs\f5%s\fr\' [\fs\f0%s\fr]",pcVar5,pcVar9,authname
                 ,authdesc);
      goto LAB_00138bee;
    }
    local_168.super_ucharbuf.buf = local_138;
    pcVar6 = colorname(ci);
    fmt = "\f0%s \f7claimed %s \f7as \'\fs\f5%s\fr\'";
    pcVar5 = pcVar9;
    pcVar9 = authname;
  }
  else {
    local_168.super_ucharbuf.buf = local_138;
    pcVar6 = colorname(ci);
    pcVar5 = "relinquished";
    if (val) {
      pcVar5 = "claimed";
    }
    fmt = "\f0%s \f7%s %s";
  }
  stringformatter::operator()((stringformatter *)&local_168,fmt,pcVar6,pcVar5,pcVar9);
LAB_00138bee:
  local_168.super_ucharbuf.flags = '\0';
  local_168.super_ucharbuf.len = 0;
  local_168.super_ucharbuf.maxlen = 0;
  local_168.growth = 5000;
  local_168.packet = enet_packet_create((void *)0x0,5000,1);
  local_168.super_ucharbuf.buf = (local_168.packet)->data;
  local_168.super_ucharbuf.maxlen = (int)(local_168.packet)->dataLength;
  putint(&local_168,0x23);
  sendstring((char *)local_138,&local_168);
  putint(&local_168,0x3d);
  putint(&local_168,mastermode);
  if (0 < DAT_00193844) {
    lVar4 = 0;
    iVar3 = DAT_00193844;
    do {
      lVar7 = *(long *)(clients + lVar4 * 8);
      if (0 < *(int *)(lVar7 + 0x334)) {
        putint(&local_168,*(int *)(lVar7 + 8));
        putint(&local_168,*(int *)(*(long *)(clients + lVar4 * 8) + 0x334));
        iVar3 = DAT_00193844;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  putint(&local_168,-1);
  enet_packet_resize(local_168.packet,(long)local_168.super_ucharbuf.len);
  local_168.super_ucharbuf.buf = (local_168.packet)->data;
  local_168.super_ucharbuf.maxlen = (int)(local_168.packet)->dataLength;
  sendpacket(-1,1,local_168.packet,-1);
  checkpausegame();
  if (((0 < local_168.growth) && (local_168.packet != (ENetPacket *)0x0)) &&
     ((local_168.packet)->referenceCount == 0)) {
    enet_packet_destroy(local_168.packet);
  }
  return true;
}

Assistant:

bool setmaster(clientinfo *ci, bool val, const char *pass = "", const char *authname = NULL, const char *authdesc = NULL, int authpriv = PRIV_MASTER, bool force = false, bool trial = false)
    {
        if(authname && !val) return false;
        const char *name = "";
        if(val)
        {
            bool haspass = adminpass[0] && checkpassword(ci, adminpass, pass);
            int wantpriv = ci->local || haspass ? PRIV_ADMIN : authpriv;
            if(wantpriv <= ci->privilege) return true;
            else if(wantpriv <= PRIV_MASTER && !force)
            {
                if(ci->state.state==CS_SPECTATOR)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Spectators may not claim master.");
                    return false;
                }
                if(!enablemultiplemasters) {
                    loopv(clients) if(ci!=clients[i] && clients[i]->privilege)
                    {
                        sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Someone already has privileges");
                        return false;
                    }
                }
                if(!authname && !(mastermask&MM_AUTOAPPROVE) && !ci->privilege && !ci->local)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "This server requires you to use the \"/auth\" command to claim master.");
                    return false;
                }
            }
            if(trial) return true;
            ci->privilege = wantpriv;
            name = privname(ci->privilege);
        }
        else
        {
            if(!ci->privilege) return false;
            if(trial) return true;
            name = privname(ci->privilege);
            revokemaster(ci);
        }
        bool hasmaster = false;
        loopv(clients) if(clients[i]->local || clients[i]->privilege >= PRIV_MASTER) hasmaster = true;
        if(!hasmaster)
        {
            mastermode = MM_OPEN;
            allowedips.shrink(0);
        }
        string msg;
        if(val && authname)
        {
            if(authdesc && authdesc[0]) formatstring(msg)("\f0%s \f7claimed \f6%s \f7as '\fs\f5%s\fr' [\fs\f0%s\fr]", colorname(ci), name, authname, authdesc);
            else formatstring(msg)("\f0%s \f7claimed %s \f7as '\fs\f5%s\fr'", colorname(ci), name, authname);
        }
        else formatstring(msg)("\f0%s \f7%s %s", colorname(ci), val ? "claimed" : "relinquished", name);
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SERVMSG);
        sendstring(msg, p);
        putint(p, N_CURRENTMASTER);
        putint(p, mastermode);
        loopv(clients) if(clients[i]->privilege >= PRIV_MASTER)
        {
            putint(p, clients[i]->clientnum);
            putint(p, clients[i]->privilege);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        checkpausegame();
        return true;
    }